

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2
          (ReflectionTester *this,Message *message)

{
  bool bVar1;
  int32_t iVar2;
  FieldDescriptor *pFVar3;
  string *psVar4;
  Message *pMVar5;
  Reflection *this_00;
  pointer *__ptr;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr_1;
  Metadata MVar7;
  string scratch;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  float local_58 [2];
  string local_50;
  
  MVar7 = Message::GetMetadata(message);
  this_00 = MVar7.reflection;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_a8.data_._0_4_ = 2;
  local_98 = (undefined1  [8])&local_88;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_int32","");
  pFVar3 = F(this,(string *)local_98);
  local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"2","reflection->FieldSize(message, F(\"repeated_int32\"))",
             (int *)&local_a8,(int *)local_58);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x24c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
  }
  else {
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    local_a8.data_._0_4_ = 2;
    local_98 = (undefined1  [8])&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_int64","");
    pFVar3 = F(this,(string *)local_98);
    local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_78,"2","reflection->FieldSize(message, F(\"repeated_int64\"))",
               (int *)&local_a8,(int *)local_58);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
    }
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_98);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x24d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
    }
    else {
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      local_a8.data_._0_4_ = 2;
      local_98 = (undefined1  [8])&local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_uint32","");
      pFVar3 = F(this,(string *)local_98);
      local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_78,"2","reflection->FieldSize(message, F(\"repeated_uint32\"))",
                 (int *)&local_a8,(int *)local_58);
      if (local_98 != (undefined1  [8])&local_88) {
        operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
      }
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_98);
        if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_70->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x24e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
      }
      else {
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
        local_a8.data_._0_4_ = 2;
        local_98 = (undefined1  [8])&local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_uint64","");
        pFVar3 = F(this,(string *)local_98);
        local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"2","reflection->FieldSize(message, F(\"repeated_uint64\"))"
                   ,(int *)&local_a8,(int *)local_58);
        if (local_98 != (undefined1  [8])&local_88) {
          operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
        }
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_98);
          if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar6 = (local_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x24f,pcVar6);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
        }
        else {
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70,local_70);
          }
          local_a8.data_._0_4_ = 2;
          local_98 = (undefined1  [8])&local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_sint32","");
          pFVar3 = F(this,(string *)local_98);
          local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_78,"2",
                     "reflection->FieldSize(message, F(\"repeated_sint32\"))",(int *)&local_a8,
                     (int *)local_58);
          if (local_98 != (undefined1  [8])&local_88) {
            operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
          }
          if (local_78[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_98);
            if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar6 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar6 = (local_70->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x250,pcVar6);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
          }
          else {
            if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_70,local_70);
            }
            local_a8.data_._0_4_ = 2;
            local_98 = (undefined1  [8])&local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"repeated_sint64","")
            ;
            pFVar3 = F(this,(string *)local_98);
            local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_78,"2",
                       "reflection->FieldSize(message, F(\"repeated_sint64\"))",(int *)&local_a8,
                       (int *)local_58);
            if (local_98 != (undefined1  [8])&local_88) {
              operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
            }
            if (local_78[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_98);
              if (local_70 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = anon_var_dwarf_a22956 + 5;
              }
              else {
                pcVar6 = (local_70->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x251,pcVar6);
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
            }
            else {
              if (local_70 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_70,local_70);
              }
              local_a8.data_._0_4_ = 2;
              local_98 = (undefined1  [8])&local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,"repeated_fixed32","");
              pFVar3 = F(this,(string *)local_98);
              local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_78,"2",
                         "reflection->FieldSize(message, F(\"repeated_fixed32\"))",(int *)&local_a8,
                         (int *)local_58);
              if (local_98 != (undefined1  [8])&local_88) {
                operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
              }
              if (local_78[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_98);
                if (local_70 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = anon_var_dwarf_a22956 + 5;
                }
                else {
                  pcVar6 = (local_70->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x252,pcVar6);
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
              }
              else {
                if (local_70 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_70,local_70);
                }
                local_a8.data_._0_4_ = 2;
                local_98 = (undefined1  [8])&local_88;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"repeated_fixed64","");
                pFVar3 = F(this,(string *)local_98);
                local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_78,"2",
                           "reflection->FieldSize(message, F(\"repeated_fixed64\"))",
                           (int *)&local_a8,(int *)local_58);
                if (local_98 != (undefined1  [8])&local_88) {
                  operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                }
                if (local_78[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_98);
                  if (local_70 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = anon_var_dwarf_a22956 + 5;
                  }
                  else {
                    pcVar6 = (local_70->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x253,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
                }
                else {
                  if (local_70 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_70,local_70);
                  }
                  local_a8.data_._0_4_ = 2;
                  local_98 = (undefined1  [8])&local_88;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_98,"repeated_sfixed32","");
                  pFVar3 = F(this,(string *)local_98);
                  local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_78,"2",
                             "reflection->FieldSize(message, F(\"repeated_sfixed32\"))",
                             (int *)&local_a8,(int *)local_58);
                  if (local_98 != (undefined1  [8])&local_88) {
                    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                  }
                  if (local_78[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_98);
                    if (local_70 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar6 = anon_var_dwarf_a22956 + 5;
                    }
                    else {
                      pcVar6 = (local_70->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x254,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
                  }
                  else {
                    if (local_70 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_70,local_70);
                    }
                    local_a8.data_._0_4_ = 2;
                    local_98 = (undefined1  [8])&local_88;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_98,"repeated_sfixed64","");
                    pFVar3 = F(this,(string *)local_98);
                    local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_78,"2",
                               "reflection->FieldSize(message, F(\"repeated_sfixed64\"))",
                               (int *)&local_a8,(int *)local_58);
                    if (local_98 != (undefined1  [8])&local_88) {
                      operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                    }
                    if (local_78[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_98);
                      if (local_70 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar6 = anon_var_dwarf_a22956 + 5;
                      }
                      else {
                        pcVar6 = (local_70->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_a8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x255,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
                    }
                    else {
                      if (local_70 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_70,local_70);
                      }
                      local_a8.data_._0_4_ = 2;
                      local_98 = (undefined1  [8])&local_88;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_98,"repeated_float","");
                      pFVar3 = F(this,(string *)local_98);
                      local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_78,"2",
                                 "reflection->FieldSize(message, F(\"repeated_float\"))",
                                 (int *)&local_a8,(int *)local_58);
                      if (local_98 != (undefined1  [8])&local_88) {
                        operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                      }
                      if (local_78[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_98);
                        if (local_70 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar6 = anon_var_dwarf_a22956 + 5;
                        }
                        else {
                          pcVar6 = (local_70->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_a8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x256,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
                      }
                      else {
                        if (local_70 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_70,local_70);
                        }
                        local_a8.data_._0_4_ = 2;
                        local_98 = (undefined1  [8])&local_88;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_98,"repeated_double","");
                        pFVar3 = F(this,(string *)local_98);
                        local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_78,"2",
                                   "reflection->FieldSize(message, F(\"repeated_double\"))",
                                   (int *)&local_a8,(int *)local_58);
                        if (local_98 != (undefined1  [8])&local_88) {
                          operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                        }
                        if (local_78[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_98);
                          if (local_70 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar6 = anon_var_dwarf_a22956 + 5;
                          }
                          else {
                            pcVar6 = (local_70->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_a8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,599,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
                        }
                        else {
                          if (local_70 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_70,local_70);
                          }
                          local_a8.data_._0_4_ = 2;
                          local_98 = (undefined1  [8])&local_88;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_98,"repeated_bool","");
                          pFVar3 = F(this,(string *)local_98);
                          local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_78,"2",
                                     "reflection->FieldSize(message, F(\"repeated_bool\"))",
                                     (int *)&local_a8,(int *)local_58);
                          if (local_98 != (undefined1  [8])&local_88) {
                            operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                          }
                          if (local_78[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_98);
                            if (local_70 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar6 = anon_var_dwarf_a22956 + 5;
                            }
                            else {
                              pcVar6 = (local_70->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,600,pcVar6);
                            testing::internal::AssertHelper::operator=
                                      (&local_a8,(Message *)local_98);
                          }
                          else {
                            if (local_70 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_70,local_70);
                            }
                            local_a8.data_._0_4_ = 2;
                            local_98 = (undefined1  [8])&local_88;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_98,"repeated_string","");
                            pFVar3 = F(this,(string *)local_98);
                            local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_78,"2",
                                       "reflection->FieldSize(message, F(\"repeated_string\"))",
                                       (int *)&local_a8,(int *)local_58);
                            if (local_98 != (undefined1  [8])&local_88) {
                              operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
                            }
                            if (local_78[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_98);
                              if (local_70 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar6 = anon_var_dwarf_a22956 + 5;
                              }
                              else {
                                pcVar6 = (local_70->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_a8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x259,pcVar6);
                              testing::internal::AssertHelper::operator=
                                        (&local_a8,(Message *)local_98);
                            }
                            else {
                              if (local_70 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_70,local_70);
                              }
                              local_a8.data_._0_4_ = 2;
                              local_98 = (undefined1  [8])&local_88;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_98,"repeated_bytes","");
                              pFVar3 = F(this,(string *)local_98);
                              local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_78,"2",
                                         "reflection->FieldSize(message, F(\"repeated_bytes\"))",
                                         (int *)&local_a8,(int *)local_58);
                              if (local_98 != (undefined1  [8])&local_88) {
                                operator_delete((void *)local_98,local_88._M_allocated_capacity + 1)
                                ;
                              }
                              if (local_78[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_98);
                                if (local_70 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar6 = anon_var_dwarf_a22956 + 5;
                                }
                                else {
                                  pcVar6 = (local_70->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_a8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x25a,pcVar6);
                                testing::internal::AssertHelper::operator=
                                          (&local_a8,(Message *)local_98);
                              }
                              else {
                                if (local_70 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_70,local_70);
                                }
                                local_a8.data_._0_4_ = 2;
                                local_98 = (undefined1  [8])&local_88;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_98,"repeatedgroup","");
                                pFVar3 = F(this,(string *)local_98);
                                local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_78,"2",
                                           "reflection->FieldSize(message, F(\"repeatedgroup\"))",
                                           (int *)&local_a8,(int *)local_58);
                                if (local_98 != (undefined1  [8])&local_88) {
                                  operator_delete((void *)local_98,
                                                  local_88._M_allocated_capacity + 1);
                                }
                                if (local_78[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)local_98);
                                  if (local_70 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                  }
                                  else {
                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_a8,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x25c,pcVar6);
                                  testing::internal::AssertHelper::operator=
                                            (&local_a8,(Message *)local_98);
                                }
                                else {
                                  if (local_70 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                  }
                                  local_a8.data_._0_4_ = 2;
                                  local_98 = (undefined1  [8])&local_88;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_98,"repeated_nested_message","");
                                  pFVar3 = F(this,(string *)local_98);
                                  local_58[0] = (float)Reflection::FieldSize(this_00,message,pFVar3)
                                  ;
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_78,"2",
                                             "reflection->FieldSize(message, F(\"repeated_nested_message\"))"
                                             ,(int *)&local_a8,(int *)local_58);
                                  if (local_98 != (undefined1  [8])&local_88) {
                                    operator_delete((void *)local_98,
                                                    local_88._M_allocated_capacity + 1);
                                  }
                                  if (local_78[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)local_98);
                                    if (local_70 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar6 = anon_var_dwarf_a22956 + 5;
                                    }
                                    else {
                                      pcVar6 = (local_70->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_a8,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x25d,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              (&local_a8,(Message *)local_98);
                                  }
                                  else {
                                    if (local_70 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                    }
                                    local_a8.data_._0_4_ = 2;
                                    local_98 = (undefined1  [8])&local_88;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_98,"repeated_foreign_message","");
                                    pFVar3 = F(this,(string *)local_98);
                                    local_58[0] = (float)Reflection::FieldSize
                                                                   (this_00,message,pFVar3);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_78,"2",
                                               "reflection->FieldSize(message, F(\"repeated_foreign_message\"))"
                                               ,(int *)&local_a8,(int *)local_58);
                                    if (local_98 != (undefined1  [8])&local_88) {
                                      operator_delete((void *)local_98,
                                                      local_88._M_allocated_capacity + 1);
                                    }
                                    if (local_78[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_98);
                                      if (local_70 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar6 = anon_var_dwarf_a22956 + 5;
                                      }
                                      else {
                                        pcVar6 = (local_70->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_a8,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x25e,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                (&local_a8,(Message *)local_98);
                                    }
                                    else {
                                      if (local_70 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                      }
                                      local_a8.data_._0_4_ = 2;
                                      local_98 = (undefined1  [8])&local_88;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_98,"repeated_import_message","");
                                      pFVar3 = F(this,(string *)local_98);
                                      local_58[0] = (float)Reflection::FieldSize
                                                                     (this_00,message,pFVar3);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_78,"2",
                                                 "reflection->FieldSize(message, F(\"repeated_import_message\"))"
                                                 ,(int *)&local_a8,(int *)local_58);
                                      if (local_98 != (undefined1  [8])&local_88) {
                                        operator_delete((void *)local_98,
                                                        local_88._M_allocated_capacity + 1);
                                      }
                                      if (local_78[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_98);
                                        if (local_70 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar6 = anon_var_dwarf_a22956 + 5;
                                        }
                                        else {
                                          pcVar6 = (local_70->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_a8,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x25f,pcVar6);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_a8,(Message *)local_98);
                                      }
                                      else {
                                        if (local_70 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                        }
                                        local_a8.data_._0_4_ = 2;
                                        local_98 = (undefined1  [8])&local_88;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_98,"repeated_lazy_message","");
                                        pFVar3 = F(this,(string *)local_98);
                                        local_58[0] = (float)Reflection::FieldSize
                                                                       (this_00,message,pFVar3);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)local_78,"2",
                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_lazy_message\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                        if (local_98 != (undefined1  [8])&local_88) {
                                          operator_delete((void *)local_98,
                                                          local_88._M_allocated_capacity + 1);
                                        }
                                        if (local_78[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)local_98);
                                          if (local_70 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar6 = anon_var_dwarf_a22956 + 5;
                                          }
                                          else {
                                            pcVar6 = (local_70->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_a8,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x260,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_a8,(Message *)local_98);
                                        }
                                        else {
                                          if (local_70 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                          }
                                          local_a8.data_._0_4_ = 2;
                                          local_98 = (undefined1  [8])&local_88;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)local_98,"repeated_nested_enum","");
                                          pFVar3 = F(this,(string *)local_98);
                                          local_58[0] = (float)Reflection::FieldSize
                                                                         (this_00,message,pFVar3);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)local_78,"2",
                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_nested_enum\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                          if (local_98 != (undefined1  [8])&local_88) {
                                            operator_delete((void *)local_98,
                                                            local_88._M_allocated_capacity + 1);
                                          }
                                          if (local_78[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)local_98);
                                            if (local_70 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar6 = anon_var_dwarf_a22956 + 5;
                                            }
                                            else {
                                              pcVar6 = (local_70->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_a8,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x261,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_a8,(Message *)local_98);
                                          }
                                          else {
                                            if (local_70 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                            }
                                            local_a8.data_._0_4_ = 2;
                                            local_98 = (undefined1  [8])&local_88;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)local_98,"repeated_foreign_enum",""
                                                      );
                                            pFVar3 = F(this,(string *)local_98);
                                            local_58[0] = (float)Reflection::FieldSize
                                                                           (this_00,message,pFVar3);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)local_78,"2",
                                                                                                              
                                                  "reflection->FieldSize(message, F(\"repeated_foreign_enum\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                            if (local_98 != (undefined1  [8])&local_88) {
                                              operator_delete((void *)local_98,
                                                              local_88._M_allocated_capacity + 1);
                                            }
                                            if (local_78[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)local_98);
                                              if (local_70 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar6 = anon_var_dwarf_a22956 + 5;
                                              }
                                              else {
                                                pcVar6 = (local_70->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_a8,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x262,pcVar6);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_a8,(Message *)local_98);
                                            }
                                            else {
                                              if (local_70 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                              }
                                              local_a8.data_._0_4_ = 2;
                                              local_98 = (undefined1  [8])&local_88;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)local_98,"repeated_import_enum",
                                                         "");
                                              pFVar3 = F(this,(string *)local_98);
                                              local_58[0] = (float)Reflection::FieldSize
                                                                             (this_00,message,pFVar3
                                                                             );
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)local_78,"2",
                                                                                                                  
                                                  "reflection->FieldSize(message, F(\"repeated_import_enum\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                              if (local_98 != (undefined1  [8])&local_88) {
                                                operator_delete((void *)local_98,
                                                                local_88._M_allocated_capacity + 1);
                                              }
                                              if (local_78[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)local_98);
                                                if (local_70 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar6 = anon_var_dwarf_a22956 + 5;
                                                }
                                                else {
                                                  pcVar6 = (local_70->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_a8,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x263,pcVar6);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_a8,(Message *)local_98);
                                              }
                                              else {
                                                if (local_70 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                }
                                                local_a8.data_._0_4_ = 2;
                                                local_98 = (undefined1  [8])&local_88;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)local_98,
                                                           "repeated_string_piece","");
                                                pFVar3 = F(this,(string *)local_98);
                                                local_58[0] = (float)Reflection::FieldSize
                                                                               (this_00,message,
                                                                                pFVar3);
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_78,"2",
                                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_string_piece\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                if (local_98 != (undefined1  [8])&local_88) {
                                                  operator_delete((void *)local_98,
                                                                  local_88._M_allocated_capacity + 1
                                                                 );
                                                }
                                                if (local_78[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)local_98);
                                                  if (local_70 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x265,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                }
                                                else {
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 2;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_cord","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::FieldSize
                                                                                 (this_00,message,
                                                                                  pFVar3);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"2",
                                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_cord\"))"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x266,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  }
                                                  else {
                                                    if (local_70 !=
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xc9;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_int32","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"201",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 0)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x268,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.83062e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_int64","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"202",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 0)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x269,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xcb;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_uint32",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedUInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_78,"203",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 0)"
                                                  ,(int *)&local_a8,(uint *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26b,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.85865e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_uint64",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_78,"204",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 0)"
                                                  ,(int *)local_58,(unsigned_long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26d,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xcd;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sint32",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"205",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 0)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.88667e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sint64",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"206",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 0)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x271,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xcf;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_fixed32",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedUInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_78,"207",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 0)"
                                                  ,(int *)&local_a8,(uint *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x273,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.9147e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_fixed64",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_78,"208",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 0)"
                                                  ,(int *)local_58,(unsigned_long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x275,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xd1;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sfixed32",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"209",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 0)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x277,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.94273e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sfixed64",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"210",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 0)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x279,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0xd3;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_float","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = Reflection::GetRepeatedFloat
                                                                          (this_00,message,pFVar3,0)
                                                  ;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_78,"211",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 0)"
                                                  ,(int *)&local_a8,local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 2.97075e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_double",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedDouble
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_78,"212",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 0)"
                                                  ,(int *)local_58,(double *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27c,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_bool","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  bVar1 = Reflection::GetRepeatedBool
                                                                    (this_00,message,pFVar3,0);
                                                  local_78[0] = (internal)bVar1;
                                                  local_70 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (local_98 == (undefined1  [8])&local_88) {
                                                    if (!bVar1) goto LAB_0065ec5a;
                                                  }
                                                  else {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                    if (((ulong)local_78 & 1) == 0) {
LAB_0065ec5a:
                                                      testing::Message::Message
                                                                ((Message *)&local_a8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)local_98,
                                                                 (internal *)local_78,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 0)"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_58,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27d,(char *)local_98);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_58,
                                                             (Message *)&local_a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_ != (AssertHelperData *)0x0) {
                                                    (**(code **)(*(long *)local_a8.data_ + 8))();
                                                  }
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_string",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 0)"
                                                  ,(char (*) [4])"215",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_bytes","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 0)"
                                                  ,(char (*) [4])"216",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x281,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_string",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 0, &scratch)"
                                                  ,(char (*) [4])"215",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x284,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_bytes","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 0, &scratch)"
                                                  ,(char (*) [4])"216",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x286,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeatedgroup","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0xd9;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->repeated_group_a_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"217",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_nested_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0xda;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"218",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28e,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_foreign_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0xdb;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->foreign_c_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"219",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x292,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_import_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0xdc;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->import_d_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"220",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x296,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_lazy_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0xe3;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"227",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_nested_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"nested_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 0)"
                                                  ,&this->nested_bar_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29d,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_foreign_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"foreign_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 0)"
                                                  ,&this->foreign_bar_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_import_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"import_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 0)"
                                                  ,&this->import_bar_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a1,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,
                                                             "repeated_string_piece","");
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 0)"
                                                  ,(char (*) [4])"224",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_string_piece","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 0, &scratch)"
                                                  ,(char (*) [4])"224",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_cord","");
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 0)"
                                                  ,(char (*) [4])"225",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_cord","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 0, &scratch)"
                                                  ,(char (*) [4])"225",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ab,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x12d;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_int32","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"301",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 1)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ad,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.23192e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_int64","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"302",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 1)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ae,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x12f;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_uint32",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedUInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_78,"303",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 1)"
                                                  ,(int *)&local_a8,(uint *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b0,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.25995e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_uint64",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_78,"304",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 1)"
                                                  ,(int *)local_58,(unsigned_long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x131;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sint32",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"305",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 1)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.28797e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sint64",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"306",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 1)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x133;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_fixed32",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedUInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_78,"307",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 1)"
                                                  ,(int *)&local_a8,(uint *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b8,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.316e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_fixed64",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_78,"308",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 1)"
                                                  ,(int *)local_58,(unsigned_long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ba,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x135;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sfixed32",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = (float)Reflection::GetRepeatedInt32
                                                                                 (this_00,message,
                                                                                  pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_78,"309",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 1)"
                                                  ,(int *)&local_a8,(int *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,700,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.34403e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_sfixed64",
                                                             "");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_78,"310",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 1)"
                                                  ,(int *)local_58,(long *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2be,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_a8.data_._0_4_ = 0x137;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_float","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_58[0] = Reflection::GetRepeatedFloat
                                                                          (this_00,message,pFVar3,1)
                                                  ;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_78,"311",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 1)"
                                                  ,(int *)&local_a8,local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2bf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_58[0] = 4.37205e-43;
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_double",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedDouble
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_78,"312",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 1)"
                                                  ,(int *)local_58,(double *)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c1,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_bool","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  bVar1 = Reflection::GetRepeatedBool
                                                                    (this_00,message,pFVar3,1);
                                                  local_78[0] = (internal)!bVar1;
                                                  local_70 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (local_98 == (undefined1  [8])&local_88) {
                                                    if (bVar1) goto LAB_0066091b;
                                                  }
                                                  else {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                    if (((ulong)local_78 & 1) == 0) {
LAB_0066091b:
                                                      testing::Message::Message
                                                                ((Message *)&local_a8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)local_98,
                                                                 (internal *)local_78,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 1)"
                                                  ,"true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_58,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c2,(char *)local_98);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_58,
                                                             (Message *)&local_a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_58);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_ != (AssertHelperData *)0x0) {
                                                    (**(code **)(*(long *)local_a8.data_ + 8))();
                                                  }
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_string",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 1)"
                                                  ,(char (*) [4])"315",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_bytes","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 1)"
                                                  ,(char (*) [4])"316",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_string",""
                                                            );
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 1, &scratch)"
                                                  ,(char (*) [4])"315",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_bytes","")
                                                  ;
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 1, &scratch)"
                                                  ,(char (*) [4])"316",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cb,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeatedgroup","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0x13d;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->repeated_group_a_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"317",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_nested_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0x13e;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"318",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d3,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_foreign_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0x13f;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->foreign_c_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"319",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d7,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_import_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0x140;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->import_d_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"320",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2db,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_lazy_message","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_78._0_4_ = 0x147;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  local_a8.data_._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_98,"327",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)local_78,(int *)&local_a8);
                                                  if (local_98[0] == (string)0x0) {
                                                    testing::Message::Message((Message *)local_78);
                                                    if (local_90 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_90->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2df,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_78 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(long *)local_78 + 8))();
                                                  }
                                                  }
                                                  if (local_90 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_90,local_90);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_nested_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"nested_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 1)"
                                                  ,&this->nested_baz_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_foreign_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"foreign_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 1)"
                                                  ,&this->foreign_baz_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_import_enum","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  local_a8.data_ =
                                                       (AssertHelperData *)
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)local_78,"import_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 1)"
                                                  ,&this->import_baz_,
                                                  (EnumValueDescriptor **)&local_a8);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,
                                                             "repeated_string_piece","");
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 1)"
                                                  ,(char (*) [4])"324",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,
                                                             "repeated_string_piece","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 1, &scratch)"
                                                  ,(char (*) [4])"324",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_70 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2eb,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a8);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_70 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_70,local_70);
                                                  }
                                                  local_78 = (undefined1  [8])&local_68;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_78,"repeated_cord","");
                                                  pFVar3 = F(this,(string *)local_78);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)local_98,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&local_a8,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 1)"
                                                  ,(char (*) [4])"325",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78 != (undefined1  [8])&local_68) {
                                                    operator_delete((void *)local_78,
                                                                    local_68._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_a8.data_._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_98);
                                                    if (local_a0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_a0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)local_78,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ee,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)local_78,
                                                             (Message *)local_98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)local_78);
                                                  if (local_98 != (undefined1  [8])0x0) {
                                                    (**(code **)(*(size_type *)local_98 + 8))();
                                                  }
                                                  }
                                                  if (local_a0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a0,local_a0);
                                                  }
                                                  local_98 = (undefined1  [8])&local_88;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_98,"repeated_cord","");
                                                  pFVar3 = F(this,(string *)local_98);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &local_50);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_78,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 1, &scratch)"
                                                  ,(char (*) [4])"325",psVar4);
                                                  if (local_98 != (undefined1  [8])&local_88) {
                                                    operator_delete((void *)local_98,
                                                                    local_88._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  if (local_78[0] != (internal)0x0)
                                                  goto LAB_006619f4;
                                                  testing::Message::Message((Message *)local_98);
                                                  if (local_70 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_70->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2f0,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a8,(Message *)local_98);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (local_98 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_98 + 8))();
  }
LAB_006619f4:
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2(
    const Message& message) {
  const Reflection* reflection = message.GetReflection();
  std::string scratch;
  const Message* sub_message;

  // -----------------------------------------------------------------

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_float")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_double")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bool")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bytes")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeatedgroup")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_lazy_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_enum")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string_piece")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_cord")));

  EXPECT_EQ(201, reflection->GetRepeatedInt32(message, F("repeated_int32"), 0));
  EXPECT_EQ(202, reflection->GetRepeatedInt64(message, F("repeated_int64"), 0));
  EXPECT_EQ(203,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 0));
  EXPECT_EQ(204,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 0));
  EXPECT_EQ(205,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 0));
  EXPECT_EQ(206,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 0));
  EXPECT_EQ(207,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 0));
  EXPECT_EQ(208,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 0));
  EXPECT_EQ(209,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 0));
  EXPECT_EQ(210,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 0));
  EXPECT_EQ(211, reflection->GetRepeatedFloat(message, F("repeated_float"), 0));
  EXPECT_EQ(212,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 0));
  EXPECT_TRUE(reflection->GetRepeatedBool(message, F("repeated_bool"), 0));
  EXPECT_EQ("215",
            reflection->GetRepeatedString(message, F("repeated_string"), 0));
  EXPECT_EQ("216",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 0));

  EXPECT_EQ("215", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 0, &scratch));
  EXPECT_EQ("216", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 0, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 0);
  EXPECT_EQ(217, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 0);
  EXPECT_EQ(218,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 0);
  EXPECT_EQ(219,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 0);
  EXPECT_EQ(220,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 0);
  EXPECT_EQ(227,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 0));
  EXPECT_EQ(foreign_bar_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 0));
  EXPECT_EQ(import_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 0));

  EXPECT_EQ("224", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 0));
  EXPECT_EQ("224", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 0, &scratch));

  EXPECT_EQ("225",
            reflection->GetRepeatedString(message, F("repeated_cord"), 0));
  EXPECT_EQ("225", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 0, &scratch));

  EXPECT_EQ(301, reflection->GetRepeatedInt32(message, F("repeated_int32"), 1));
  EXPECT_EQ(302, reflection->GetRepeatedInt64(message, F("repeated_int64"), 1));
  EXPECT_EQ(303,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 1));
  EXPECT_EQ(304,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 1));
  EXPECT_EQ(305,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 1));
  EXPECT_EQ(306,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 1));
  EXPECT_EQ(307,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 1));
  EXPECT_EQ(308,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 1));
  EXPECT_EQ(309,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 1));
  EXPECT_EQ(310,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 1));
  EXPECT_EQ(311, reflection->GetRepeatedFloat(message, F("repeated_float"), 1));
  EXPECT_EQ(312,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 1));
  EXPECT_FALSE(reflection->GetRepeatedBool(message, F("repeated_bool"), 1));
  EXPECT_EQ("315",
            reflection->GetRepeatedString(message, F("repeated_string"), 1));
  EXPECT_EQ("316",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 1));

  EXPECT_EQ("315", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 1, &scratch));
  EXPECT_EQ("316", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 1, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 1);
  EXPECT_EQ(317, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 1);
  EXPECT_EQ(318,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 1);
  EXPECT_EQ(319,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 1);
  EXPECT_EQ(320,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 1);
  EXPECT_EQ(327,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 1));
  EXPECT_EQ(foreign_baz_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 1));
  EXPECT_EQ(import_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 1));

  EXPECT_EQ("324", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 1));
  EXPECT_EQ("324", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 1, &scratch));

  EXPECT_EQ("325",
            reflection->GetRepeatedString(message, F("repeated_cord"), 1));
  EXPECT_EQ("325", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 1, &scratch));
}